

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O3

void __thiscall
optimization::global_expr_move::Global_Expr_Mov::optimize_func
          (Global_Expr_Mov *this,MirFunction *func)

{
  VarId *__v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  __index_type _Var3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  _Base_ptr p_Var7;
  pair<int,_int> *ppVar8;
  MirFunction *pMVar9;
  MirFunction *pMVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pair<int,_int> pVar11;
  _Alloc_hider _Var12;
  int iVar13;
  _Rb_tree_color _Var14;
  mapped_type *pmVar15;
  iterator __position;
  _Base_ptr p_Var16;
  long lVar17;
  _List_node_base *p_Var18;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar19;
  mapped_type *pmVar20;
  mapped_type *pmVar21;
  Inst *pIVar22;
  iterator iVar23;
  mapped_type *pmVar24;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_01;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var25;
  int *piVar26;
  undefined8 uVar27;
  _Rb_tree_node_base *p_Var28;
  _Rb_tree_node_base *p_Var29;
  long lVar30;
  long lVar31;
  _Base_ptr p_Var32;
  ulong uVar33;
  pointer puVar34;
  long lVar35;
  Tag *tag;
  char *function;
  _Base_ptr p_Var36;
  Inst *pIVar37;
  pair<int,_int> pVar38;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *this_02;
  bool bVar39;
  pair<std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_bool>
  pVar40;
  value_type start;
  int id_1;
  pair<int,_int> point;
  mapped_type var;
  list<int,_std::allocator<int>_> queue;
  LabelId id;
  mapped_type var_1;
  _Self __tmp;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  Var_Replace vp;
  Livevar_Analyse lva;
  _Rb_tree_color local_4cc;
  _Rb_tree_color local_4c8;
  ostream local_4c1;
  pointer local_4c0;
  uint local_4b4;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_4b0;
  pair<int,_int> local_4a8;
  Global_Expr_Mov *local_4a0;
  undefined1 local_498 [25];
  undefined7 uStack_47f;
  undefined8 uStack_478;
  _Alloc_hider local_470;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  size_t local_450;
  bool local_448;
  undefined8 local_440;
  pair<int,_int> local_438;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  __index_type local_400;
  undefined2 local_3ff;
  pair<int,_int> local_3f8;
  undefined1 local_3f0 [24];
  undefined1 local_3d8 [40];
  pair<int,_int> local_3b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a8;
  undefined1 local_3a0 [16];
  MirFunction *local_390;
  Displayable local_388;
  _Base_ptr local_380;
  undefined1 local_378 [16];
  _Rb_tree_node_base local_368;
  undefined **local_348;
  undefined1 local_340 [40];
  _func_int **local_318;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_310;
  pair<int,_int> local_2e0;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [24];
  VarId local_2a0;
  VarId local_290;
  VarId local_280;
  VarId local_270;
  undefined **local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined1 local_248 [48];
  undefined1 local_218 [32];
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [48];
  undefined1 local_178 [32];
  undefined1 local_158 [48];
  undefined **local_128;
  undefined4 local_120;
  __index_type local_110;
  undefined1 local_108 [56];
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  local_d0;
  Livevar_Analyse local_a0;
  
  if (((func->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      is_extern == false) {
    p_Var7 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_340._8_8_ = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
    local_4a0 = this;
    local_390 = func;
    if (p_Var7 != (_Base_ptr)local_340._8_8_) {
      p_Var16 = p_Var7;
      do {
        __position._M_current =
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             p_Var16[3]._M_parent;
        if ((_Base_ptr)__position._M_current != p_Var16[3]._M_left) {
          do {
            iVar13 = (*((((__position._M_current)->_M_t).
                         super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                         .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                       super_Displayable)._vptr_Displayable[1])();
            if (iVar13 == 2) {
              if (*(int *)&p_Var16[1]._M_left == *(int *)&p_Var7[1]._M_left) break;
              pmVar15 = std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::at(&func->variables,
                             &((((__position._M_current)->_M_t).
                                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest
                              ).id);
              pmVar15->is_temp_var = false;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                          *)&p_Var7[3]._M_parent,__position._M_current);
              __position = std::
                           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                       *)&p_Var16[3]._M_parent,__position);
            }
            else {
              __position._M_current = __position._M_current + 1;
            }
          } while ((_Base_ptr)__position._M_current != p_Var16[3]._M_left);
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while (p_Var16 != (_Base_ptr)local_340._8_8_);
    }
    local_3d8._24_8_ = &local_390->basic_blks;
    local_340._16_8_ = &local_4a0->offset;
    this_02 = &local_390->variables;
    local_318 = (_func_int **)&PTR_display_001ed048;
    local_388._vptr_Displayable = (_func_int **)&PTR_display_001ecfe8;
    local_340._32_8_ = &PTR_display_001ed228;
    local_4a8 = (pair<int,_int>)&PTR_display_001ecf98;
    local_4b0 = this_02;
    do {
      pMVar10 = local_390;
      livevar_analyse::Livevar_Analyse::Livevar_Analyse(&local_a0,local_390,false);
      livevar_analyse::Livevar_Analyse::build(&local_a0);
      var_replace::Var_Replace::Var_Replace((Var_Replace *)local_108,pMVar10);
      local_498._0_8_ = (Env *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<optimization::global_expr_move::Env,std::allocator<optimization::global_expr_move::Env>,mir::inst::MirFunction&,optimization::livevar_analyse::Livevar_Analyse&,optimization::var_replace::Var_Replace&,bool&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_498 + 8),(Env **)local_498,
                 (allocator<optimization::global_expr_move::Env> *)local_420,pMVar10,&local_a0,
                 (Var_Replace *)local_108,(bool *)local_340._16_8_);
      uVar27 = local_498._8_8_;
      env = (Env *)local_498._0_8_;
      this_00 = _DAT_001ee4e8;
      local_498._0_8_ = (Env *)0x0;
      local_498._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _DAT_001ee4e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar27;
      if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_ !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_);
      }
      local_3d8._16_8_ = (_Base_ptr)0x0;
      local_310._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_310._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_310._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_310._M_impl.super__Rb_tree_header._M_header;
      local_310._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3d8._0_8_ = (MirFunction *)local_3d8;
      local_3d8._8_8_ = (MirFunction *)local_3d8;
      local_310._M_impl.super__Rb_tree_header._M_header._M_right =
           local_310._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar17 = std::_Rb_tree_decrement((_Rb_tree_node_base *)local_340._8_8_);
      p_Var18 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var18[1]._M_next = *(undefined4 *)(lVar17 + 0x20);
      std::__detail::_List_node_base::_M_hook(p_Var18);
      local_3d8._16_8_ = (long)(_Rb_tree_color *)local_3d8._16_8_ + 1;
      if ((MirFunction *)local_3d8._0_8_ == (MirFunction *)local_3d8) {
        local_4b4 = 0;
      }
      else {
        local_4b4 = 0;
        do {
          uVar27 = local_3d8._0_8_;
          local_4cc = (_Rb_tree_color)*(size_type *)(local_3d8._0_8_ + 0x10);
          local_3d8._16_8_ = (long)&((_Base_ptr)(local_3d8._16_8_ + -0x20))->_M_right + 7;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete((void *)uVar27,0x18);
          if (local_310._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0012f7b9:
            local_3d8._32_8_ =
                 std::
                 map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                 ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                       *)local_3d8._24_8_,(key_type *)&local_4cc);
            local_380 = (_Base_ptr)
                        std::
                        map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                        ::operator[](&local_a0.livevars,(key_type *)&local_4cc);
            puVar34 = (((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)(local_3d8._32_8_ + 0x40))->
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            while (puVar34 != *(pointer *)(local_3d8._32_8_ + 0x48)) {
              pmVar15 = std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::at(this_02,&(((puVar34->_M_t).
                                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                       _M_head_impl)->dest).id);
              if (pmVar15->is_phi_var == true) {
LAB_001300a6:
                puVar34 = puVar34 + 1;
              }
              else {
                iVar13 = (*(((puVar34->_M_t).
                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                           super_Displayable)._vptr_Displayable[1])();
                pIVar37 = (puVar34->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                if (iVar13 == 1) {
                  if ((pIVar37->super_Displayable)._vptr_Displayable != local_318) {
                    pIVar37 = (Inst *)0x0;
                  }
                  _Var3 = *(__index_type *)&pIVar37[2].super_Displayable._vptr_Displayable;
                  if (((long)(char)_Var3 != 0) ||
                     (*(char *)&pIVar37[3].dest.super_Displayable._vptr_Displayable != '\0')) {
                    local_4c8 = ~_S_red;
                    uVar6 = pIVar37[3].dest.id;
                    __v = &pIVar37[1].dest;
                    local_498._0_8_ = local_2b8;
                    local_4c0 = puVar34;
                    local_2b8[0x10] = _Var3;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)_Var3 + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_498,
                               (variant<int,_mir::inst::VarId> *)__v);
                    pVar38 = local_4a8;
                    local_2d8._24_4_ = local_4a8.first;
                    local_2d8._28_4_ = local_4a8.second;
                    local_2b8._17_2_ =
                         *(undefined2 *)((long)&pIVar37[2].super_Displayable._vptr_Displayable + 1);
                    local_340._24_8_ = &pIVar37[2].dest.id;
                    local_2d8[0x10] =
                         *(__index_type *)&pIVar37[3].dest.super_Displayable._vptr_Displayable;
                    local_498._0_8_ = local_2d8;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)local_2d8[0x10] + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_498,
                               (variant<int,_mir::inst::VarId> *)local_340._24_8_);
                    local_2e0 = pVar38;
                    local_2d8._17_2_ =
                         *(undefined2 *)
                          ((long)&pIVar37[3].dest.super_Displayable._vptr_Displayable + 1);
                    local_420._0_4_ = uVar6;
                    local_400 = local_2b8[0x10];
                    local_498._0_8_ = local_410;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)local_2b8[0x10] + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_498,
                               (variant<int,_mir::inst::VarId> *)local_2b8);
                    pVar11 = local_4a8;
                    local_4a8.first = pVar38.first;
                    local_4a8.second = pVar38.second;
                    local_420._8_4_ = local_4a8.first;
                    local_420._12_4_ = local_4a8.second;
                    local_3ff = local_2b8._17_2_;
                    local_3f0[0x10] = local_2d8[0x10];
                    local_498._0_8_ = local_3f0;
                    local_4a8 = pVar11;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)local_2d8[0x10] + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_498,
                               (variant<int,_mir::inst::VarId> *)local_2d8);
                    local_3f8 = pVar38;
                    local_3f0._17_2_ = local_2d8._17_2_;
                    cVar2 = *(char *)&pIVar37[3].dest.super_Displayable._vptr_Displayable;
                    if (*(char *)&pIVar37[2].super_Displayable._vptr_Displayable == '\0') {
                      pVar38 = local_4a8;
                      if (cVar2 == '\0') {
LAB_00130096:
                        puVar34 = local_4c0;
                        this_02 = local_4b0;
                        if (local_4c8 != local_4cc) {
                          pmVar20 = std::
                                    map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                                    ::at(&env->blk_op_map,(key_type *)&local_4c8);
                          iVar23 = std::
                                   _Hashtable<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   ::find((_Hashtable<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                           *)pmVar20,(key_type *)local_420);
                          if (iVar23.
                              super__Node_iterator_base<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_true>
                              ._M_cur == (__node_type *)0x0) {
                            std::__throw_out_of_range("_Map_base::at");
                          }
                          local_348 = &PTR_display_001eb100;
                          local_340._0_4_ =
                               *(uint32_t *)
                                ((long)iVar23.
                                       super__Node_iterator_base<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_true>
                                       ._M_cur + 0x58);
                          tag = (Tag *)local_340;
                          pmVar15 = std::
                                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                    ::at(local_4b0,(key_type_conflict *)tag);
                          if (pmVar15->is_phi_var == true) {
                            uVar6 = (((local_4c0->_M_t).
                                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)
                                    ->dest).id;
                            uVar33 = (ulong)local_4c8;
                            pmVar24 = std::
                                      map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                      ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                            *)local_3d8._24_8_,(key_type *)&local_4c8);
                            local_498._0_8_ = &PTR_display_001eb100;
                            local_498._8_4_ = uVar6;
                            local_498._16_8_ =
                                 ((long)(pmVar24->inst).
                                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pmVar24->inst).
                                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start &
                                 0xfffffffffffffff8U) << 0x1d | uVar33;
                            pVar40 = std::
                                     _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::pair<int,int>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::pair<int,int>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::pair<int,int>>>>
                                     ::
                                     _M_insert_unique<std::pair<mir::inst::VarId_const,std::pair<int,int>>>
                                               ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::pair<int,int>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::pair<int,int>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::pair<int,int>>>>
                                                 *)&local_d0,
                                                (pair<const_mir::inst::VarId,_std::pair<int,_int>_>
                                                 *)local_498);
                            pIVar37 = (local_4c0->_M_t).
                                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                            (*(pIVar37->super_Displayable)._vptr_Displayable[2])
                                      (local_498,pIVar37,pVar40._8_8_);
                            for (uVar27 = stack0xfffffffffffffb80;
                                (_Rb_tree_node_base *)uVar27 !=
                                (_Rb_tree_node_base *)(local_498 + 8);
                                uVar27 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar27)) {
                              local_378._0_8_ = &PTR_display_001eb100;
                              local_378._8_4_ =
                                   *(undefined4 *)
                                    &((_Rb_tree_node_base *)(uVar27 + 0x20))->_M_parent;
                              this_01 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>
                                         *)std::
                                           map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                           ::at((map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                                 *)(local_108 + 8),(key_type *)local_378);
                              local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          CONCAT44((int)((ulong)((long)local_4c0 -
                                                                (long)(((
                                                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  *)(local_3d8._32_8_ + 0x40))->
                                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3),
                                                  *(LabelId *)(local_3d8._32_8_ + 8));
                              _Var25 = std::
                                       __find_if<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::pair<int,int>const>>
                                                 (*(undefined8 *)this_01,
                                                  *(undefined8 *)(this_01 + 8),&local_440);
                              ppVar8 = *(pair<int,_int> **)(this_01 + 8);
                              if (_Var25._M_current != ppVar8) {
                                if ((_Var25._M_current + 1 != ppVar8) &&
                                   (lVar17 = (long)ppVar8 - (long)(_Var25._M_current + 1) >> 3,
                                   0 < lVar17)) {
                                  uVar33 = lVar17 + 1;
                                  piVar26 = &_Var25._M_current[1].second;
                                  do {
                                    *(pair<int,_int> *)(piVar26 + -3) =
                                         *(pair<int,_int> *)(piVar26 + -1);
                                    uVar33 = uVar33 - 1;
                                    piVar26 = piVar26 + 2;
                                  } while (1 < uVar33);
                                }
                                *(pair<int,_int> **)(this_01 + 8) = ppVar8 + -1;
                                pmVar24 = std::
                                          map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                          ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                                *)local_3d8._24_8_,(key_type *)&local_4c8);
                                local_3b0.second =
                                     (int)((ulong)((long)(pmVar24->inst).
                                                                                                                  
                                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar24->inst).
                                                                                                                
                                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
                                local_3b0.first = local_4c8;
                                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                                emplace_back<std::pair<int,int>>
                                          (this_01,(pair<int,_int> *)(local_3d8 + 0x28));
                              }
                            }
                            std::
                            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                         *)local_498);
                            pmVar24 = std::
                                      map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                      ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                            *)local_3d8._24_8_,(key_type *)&local_4c8);
                            std::
                            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                            ::
                            emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                      ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                        *)&pmVar24->inst,local_4c0);
                            pIVar22 = (Inst *)operator_new(0x38);
                            (pIVar22->dest).super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001eb100;
                            (pIVar22->dest).id = 0xffffffff;
                            (pIVar22->super_Displayable)._vptr_Displayable =
                                 local_388._vptr_Displayable;
                            *(undefined1 *)&pIVar22[2].super_Displayable._vptr_Displayable = 0;
                            *(undefined4 *)&pIVar22[1].dest.super_Displayable._vptr_Displayable =
                                 0xffffffff;
                            pIVar22[1].super_Displayable._vptr_Displayable = (_func_int **)pVar38;
                            *(undefined2 *)
                             ((long)&pIVar22[2].super_Displayable._vptr_Displayable + 1) = 1;
                            puVar34 = local_4c0;
                          }
                          else {
                            local_4c1 = (ostream)0x0;
                            AixLog::operator<<(&local_4c1,(Severity *)tag);
                            puVar34 = local_4c0;
                            local_378._0_8_ = &PTR__Tag_001eaf88;
                            local_378._8_8_ = &local_368._M_parent;
                            local_368._M_color = _S_red;
                            local_368._4_4_ = 0;
                            local_368._M_parent._0_1_ = 0;
                            local_368._M_right._0_1_ = 1;
                            AixLog::operator<<((ostream *)local_378,tag);
                            local_258 = std::chrono::_V2::system_clock::now();
                            local_260 = &PTR__Timestamp_001eaf58;
                            local_250 = 0;
                            AixLog::operator<<((ostream *)&local_260,(Timestamp *)tag);
                            local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_440,"optimize_func","");
                            local_3b0 = (pair<int,_int>)(local_3d8 + 0x38);
                            function = 
                            "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/global_expression_move.hpp"
                            ;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)(local_3d8 + 0x28),
                                       "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/global_expression_move.hpp"
                                       ,"");
                            local_498._0_8_ = &PTR__Function_001eafb8;
                            if (local_440 ==
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430) {
                              uStack_478 = local_430._8_8_;
                              local_498._8_8_ =
                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   (local_498 + 0x18);
                            }
                            else {
                              local_498._8_8_ = local_440;
                            }
                            uStack_47f = local_430._1_7_;
                            local_498[0x18] = local_430[0];
                            local_498._16_4_ = local_438.first;
                            local_498._20_4_ = local_438.second;
                            local_438.first = 0;
                            local_438.second = 0;
                            local_430[0] = 0;
                            local_470._M_p = (pointer)&local_460;
                            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)(local_3d8 + 0x38);
                            if (local_3b0 == (pair<int,_int>)paVar1) {
                              local_460._8_8_ = local_3a0._8_8_;
                            }
                            else {
                              local_470._M_p = (pointer)local_3b0;
                            }
                            local_460._M_allocated_capacity._1_7_ = local_3a0._1_7_;
                            local_460._M_local_buf[0] = local_3a0[0];
                            local_468 = local_3a8._M_pi;
                            local_3a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                            local_3a0[0] = 0;
                            local_450 = 0x161;
                            local_448 = false;
                            local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430;
                            local_3b0 = (pair<int,_int>)paVar1;
                            AixLog::operator<<((ostream *)local_498,(Function *)function);
                            pIVar37 = (puVar34->_M_t).
                                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                            (**(pIVar37->dest).super_Displayable._vptr_Displayable)
                                      (&pIVar37->dest,&std::clog);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::clog," is replaced to ",0x10);
                            (*(code *)*local_348)(&local_348,&std::clog);
                            std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
                            std::ostream::put(-0x80);
                            std::ostream::flush();
                            AixLog::Function::~Function((Function *)local_498);
                            if (local_3b0 != (pair<int,_int>)paVar1) {
                              operator_delete((void *)local_3b0,
                                              CONCAT71(local_3a0._1_7_,local_3a0[0]) + 1);
                            }
                            if (local_440 !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_430) {
                              operator_delete(local_440,CONCAT71(local_430._1_7_,local_430[0]) + 1);
                            }
                            local_378._0_8_ = &PTR__Tag_001eaf88;
                            if ((_Base_ptr *)local_378._8_8_ != &local_368._M_parent) {
                              operator_delete((void *)local_378._8_8_,
                                              CONCAT71(local_368._M_parent._1_7_,
                                                       local_368._M_parent._0_1_) + 1);
                            }
                            local_270.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001eb100;
                            local_270.id = (((puVar34->_M_t).
                                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                            _M_head_impl)->dest).id;
                            local_280.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001eb100;
                            local_280.id = local_340._0_4_;
                            var_replace::Var_Replace::replace
                                      ((Var_Replace *)local_108,&local_270,&local_280);
                            puVar34 = local_4c0;
                            pIVar37 = (local_4c0->_M_t).
                                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                            pIVar22 = (Inst *)operator_new(0x38);
                            uVar6 = (pIVar37->dest).id;
                            (pIVar22->dest).super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001eb100;
                            (pIVar22->dest).id = uVar6;
                            (pIVar22->super_Displayable)._vptr_Displayable =
                                 local_388._vptr_Displayable;
                            *(undefined1 *)&pIVar22[2].super_Displayable._vptr_Displayable = 0;
                            *(undefined4 *)&pIVar22[1].dest.super_Displayable._vptr_Displayable =
                                 0xfffffc19;
                            pIVar22[1].super_Displayable._vptr_Displayable = (_func_int **)pVar38;
                            *(undefined2 *)
                             ((long)&pIVar22[2].super_Displayable._vptr_Displayable + 1) = 1;
                          }
                          this_02 = local_4b0;
                          pIVar37 = (puVar34->_M_t).
                                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                          (puVar34->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar22;
                          if (pIVar37 != (Inst *)0x0) {
                            (*(pIVar37->super_Displayable)._vptr_Displayable[5])();
                          }
                          local_498._0_4_ = local_340._0_4_;
                          pmVar15 = std::
                                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                    ::at(this_02,(key_type_conflict *)local_498);
                          goto LAB_0013067c;
                        }
                      }
                      else {
                        pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)local_340._24_8_);
                        pVar38 = local_4a8;
                        _Var14 = local_4cc;
                        lVar17 = *(long *)(*(long *)(*(long *)local_380 + 0x38) + 0x10);
                        puVar34 = local_4c0;
                        this_02 = local_4b0;
                        if (lVar17 != 0) {
                          uVar4 = pvVar19->id;
                          lVar31 = *(long *)(*(long *)local_380 + 0x38) + 8;
                          lVar35 = lVar31;
                          do {
                            bVar39 = *(uint *)(lVar17 + 0x28) < uVar4;
                            if (!bVar39) {
                              lVar35 = lVar17;
                            }
                            lVar17 = *(long *)(lVar17 + 0x10 + (ulong)bVar39 * 8);
                          } while (lVar17 != 0);
                          if ((lVar35 != lVar31) && (*(uint *)(lVar35 + 0x28) <= uVar4)) {
                            local_248._0_4_ = local_420._0_4_;
                            local_248[0x20] = local_400;
                            local_498._0_8_ = local_248 + 0x10;
                            (*std::__detail::__variant::
                              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                              ::_S_vtable._M_arr[(long)(char)local_400 + 1]._M_data)
                                      ((anon_class_8_1_a78179b7_conflict *)local_498,
                                       (variant<int,_mir::inst::VarId> *)local_410);
                            pVar11 = local_4a8;
                            local_4a8.first = pVar38.first;
                            local_4a8.second = pVar38.second;
                            local_248._8_4_ = local_4a8.first;
                            local_248._12_4_ = local_4a8.second;
                            local_248._33_2_ = local_3ff;
                            local_218[0x10] = local_3f0[0x10];
                            local_498._0_8_ = local_218;
                            local_4a8 = pVar11;
                            (*std::__detail::__variant::
                              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                              ::_S_vtable._M_arr[(long)(char)local_3f0[0x10] + 1]._M_data)
                                      ((anon_class_8_1_a78179b7_conflict *)local_498,
                                       (variant<int,_mir::inst::VarId> *)local_3f0);
                            pVar11 = local_4a8;
                            local_4a8.first = pVar38.first;
                            local_4a8.second = pVar38.second;
                            local_248._40_4_ = local_4a8.first;
                            local_248._44_4_ = local_4a8.second;
                            local_218._17_2_ = local_3f0._17_2_;
                            local_218[0x18] = _S_red;
                            local_4a8 = pVar11;
                            local_4c8 = bfs(local_4a0,_Var14,
                                            (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                             *)local_248);
                            goto LAB_00130096;
                          }
                        }
                      }
                    }
                    else if (cVar2 == '\0') {
                      pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)__v);
                      pVar38 = local_4a8;
                      _Var14 = local_4cc;
                      lVar17 = *(long *)(*(long *)(*(long *)local_380 + 0x38) + 0x10);
                      puVar34 = local_4c0;
                      this_02 = local_4b0;
                      if (lVar17 != 0) {
                        uVar4 = pvVar19->id;
                        lVar31 = *(long *)(*(long *)local_380 + 0x38) + 8;
                        lVar35 = lVar31;
                        do {
                          bVar39 = *(uint *)(lVar17 + 0x28) < uVar4;
                          if (!bVar39) {
                            lVar35 = lVar17;
                          }
                          lVar17 = *(long *)(lVar17 + 0x10 + (ulong)bVar39 * 8);
                        } while (lVar17 != 0);
                        if ((lVar35 != lVar31) && (*(uint *)(lVar35 + 0x28) <= uVar4)) {
                          local_1f8._0_4_ = local_420._0_4_;
                          local_1f8[0x20] = local_400;
                          local_498._0_8_ = local_1f8 + 0x10;
                          (*std::__detail::__variant::
                            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                            ::_S_vtable._M_arr[(long)(char)local_400 + 1]._M_data)
                                    ((anon_class_8_1_a78179b7_conflict *)local_498,
                                     (variant<int,_mir::inst::VarId> *)local_410);
                          pVar11 = local_4a8;
                          local_4a8.first = pVar38.first;
                          local_4a8.second = pVar38.second;
                          local_1f8._8_4_ = local_4a8.first;
                          local_1f8._12_4_ = local_4a8.second;
                          local_1f8._33_2_ = local_3ff;
                          local_1c8[0x10] = local_3f0[0x10];
                          local_498._0_8_ = local_1c8;
                          local_4a8 = pVar11;
                          (*std::__detail::__variant::
                            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                            ::_S_vtable._M_arr[(long)(char)local_3f0[0x10] + 1]._M_data)
                                    ((anon_class_8_1_a78179b7_conflict *)local_498,
                                     (variant<int,_mir::inst::VarId> *)local_3f0);
                          pVar11 = local_4a8;
                          local_4a8.first = pVar38.first;
                          local_4a8.second = pVar38.second;
                          local_1f8._40_4_ = local_4a8.first;
                          local_1f8._44_4_ = local_4a8.second;
                          local_1c8._17_2_ = local_3f0._17_2_;
                          local_1c8[0x18] = _S_red;
                          local_4a8 = pVar11;
                          local_4c8 = bfs(local_4a0,_Var14,
                                          (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                           *)local_1f8);
                          goto LAB_00130096;
                        }
                      }
                    }
                    else {
                      pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)__v);
                      pVar38 = local_4a8;
                      uVar4 = pvVar19->id;
                      pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)local_340._24_8_);
                      _Var14 = local_4cc;
                      lVar17 = *(long *)(*(long *)(*(long *)local_380 + 0x38) + 0x10);
                      puVar34 = local_4c0;
                      this_02 = local_4b0;
                      if (lVar17 != 0) {
                        uVar5 = pvVar19->id;
                        lVar30 = *(long *)(*(long *)local_380 + 0x38) + 8;
                        lVar31 = lVar30;
                        lVar35 = lVar17;
                        do {
                          bVar39 = *(uint *)(lVar35 + 0x28) < uVar4;
                          if (!bVar39) {
                            lVar31 = lVar35;
                          }
                          lVar35 = *(long *)(lVar35 + 0x10 + (ulong)bVar39 * 8);
                        } while (lVar35 != 0);
                        if ((lVar31 != lVar30) &&
                           (lVar35 = lVar30, *(uint *)(lVar31 + 0x28) <= uVar4)) {
                          do {
                            bVar39 = *(uint *)(lVar17 + 0x28) < uVar5;
                            if (!bVar39) {
                              lVar35 = lVar17;
                            }
                            lVar17 = *(long *)(lVar17 + 0x10 + (ulong)bVar39 * 8);
                          } while (lVar17 != 0);
                          if ((lVar35 != lVar30) && (*(uint *)(lVar35 + 0x28) <= uVar5)) {
                            local_1a8._0_4_ = local_420._0_4_;
                            local_1a8[0x20] = local_400;
                            local_498._0_8_ = local_1a8 + 0x10;
                            (*std::__detail::__variant::
                              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                              ::_S_vtable._M_arr[(long)(char)local_400 + 1]._M_data)
                                      ((anon_class_8_1_a78179b7_conflict *)local_498,
                                       (variant<int,_mir::inst::VarId> *)local_410);
                            pVar11 = local_4a8;
                            local_4a8.first = pVar38.first;
                            local_4a8.second = pVar38.second;
                            local_1a8._8_4_ = local_4a8.first;
                            local_1a8._12_4_ = local_4a8.second;
                            local_1a8._33_2_ = local_3ff;
                            local_178[0x10] = local_3f0[0x10];
                            local_498._0_8_ = local_178;
                            local_4a8 = pVar11;
                            (*std::__detail::__variant::
                              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                              ::_S_vtable._M_arr[(long)(char)local_3f0[0x10] + 1]._M_data)
                                      ((anon_class_8_1_a78179b7_conflict *)local_498,
                                       (variant<int,_mir::inst::VarId> *)local_3f0);
                            pVar11 = local_4a8;
                            local_4a8.first = pVar38.first;
                            local_4a8.second = pVar38.second;
                            local_1a8._40_4_ = local_4a8.first;
                            local_1a8._44_4_ = local_4a8.second;
                            local_178._17_2_ = local_3f0._17_2_;
                            local_178[0x18] = _S_red;
                            local_4a8 = pVar11;
                            local_4c8 = bfs(local_4a0,_Var14,
                                            (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                             *)local_1a8);
                            goto LAB_00130096;
                          }
                        }
                      }
                    }
                  }
                  goto LAB_001300a6;
                }
                if ((iVar13 != 3) || (*(bool *)local_340._16_8_ != true)) goto LAB_001300a6;
                if ((pIVar37->super_Displayable)._vptr_Displayable != (_func_int **)local_340._32_8_
                   ) {
                  pIVar37 = (Inst *)0x0;
                }
                pvVar19 = std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)&pIVar37[1].dest);
                local_420._0_8_ = &PTR_display_001eb100;
                local_420._8_4_ = pvVar19->id;
                cVar2 = *(char *)&pIVar37[3].dest.super_Displayable._vptr_Displayable;
                local_3f8.first._0_1_ = cVar2;
                local_378._0_8_ = local_410 + 8;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr[(long)cVar2 + 1]._M_data)
                          ((anon_class_8_1_a78179b7_conflict *)local_378,
                           (variant<int,_mir::inst::VarId> *)&pIVar37[2].dest.id);
                local_410._0_4_ = local_4a8.first;
                local_410._4_4_ = local_4a8.second;
                local_3f8.first._1_2_ =
                     *(undefined2 *)((long)&pIVar37[3].dest.super_Displayable._vptr_Displayable + 1)
                ;
                local_498._0_8_ = &PTR_display_001eb100;
                local_498._8_4_ = local_420._8_4_;
                local_470._M_p._0_1_ = (undefined1)local_3f8.first;
                local_378._0_8_ = local_498 + 0x18;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr[(long)(char)(undefined1)local_3f8.first + 1]._M_data)
                          ((anon_class_8_1_a78179b7_conflict *)local_378,
                           (variant<int,_mir::inst::VarId> *)(local_410 + 8));
                pVar38 = local_4a8;
                _Var14 = local_4cc;
                local_498._16_4_ = local_4a8.first;
                local_498._20_4_ = local_4a8.second;
                local_470._M_p._1_2_ = local_3f8.first._1_2_;
                local_468 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_display_001eb100;
                local_460._M_allocated_capacity._0_4_ = (pIVar37->dest).id;
                local_158._0_8_ = &PTR_display_001eb100;
                local_158._8_4_ = local_498._8_4_;
                local_158[0x28] = local_470._M_p._0_1_;
                local_420._0_8_ = local_158 + 0x18;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr[(long)(char)local_470._M_p._0_1_ + 1]._M_data)
                          ((anon_class_8_1_a78179b7_conflict *)local_420,
                           (variant<int,_mir::inst::VarId> *)(local_498 + 0x18));
                _Var12._M_p = local_470._M_p;
                pVar11 = local_4a8;
                local_4a8.first = pVar38.first;
                local_4a8.second = pVar38.second;
                local_158._16_4_ = local_4a8.first;
                local_158._20_4_ = local_4a8.second;
                local_158[0x29] = local_470._M_p._1_1_;
                local_158[0x2a] = local_470._M_p._2_1_;
                local_128 = &PTR_display_001eb100;
                local_120 = local_460._M_allocated_capacity._0_4_;
                local_110 = '\x01';
                local_4a8 = pVar11;
                local_470._M_p = _Var12._M_p;
                _Var14 = bfs(local_4a0,_Var14,
                             (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                              *)local_158);
                local_378._0_4_ = _Var14;
                this_02 = local_4b0;
                if (_Var14 == local_4cc) goto LAB_001300a6;
                pmVar20 = std::
                          map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                          ::at(&env->blk_op_map,(key_type *)local_378);
                this_02 = local_4b0;
                pmVar21 = std::
                          map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
                          ::at(&pmVar20->loads,(key_type *)local_498);
                local_420._0_8_ = &PTR_display_001eb100;
                local_420._8_4_ = pmVar21->id;
                pmVar15 = std::
                          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          ::at(this_02,(key_type_conflict *)(local_420 + 8));
                if (pmVar15->is_phi_var == true) goto LAB_001300a6;
                local_290.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
                local_290.id = (((puVar34->_M_t).
                                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                 .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                               dest).id;
                local_2a0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
                local_2a0.id = local_420._8_4_;
                var_replace::Var_Replace::replace((Var_Replace *)local_108,&local_290,&local_2a0);
                pIVar37 = (puVar34->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                pIVar22 = (Inst *)operator_new(0x38);
                uVar6 = (pIVar37->dest).id;
                (pIVar22->dest).super_Displayable._vptr_Displayable =
                     (_func_int **)&PTR_display_001eb100;
                (pIVar22->dest).id = uVar6;
                (pIVar22->super_Displayable)._vptr_Displayable = local_388._vptr_Displayable;
                *(undefined1 *)&pIVar22[2].super_Displayable._vptr_Displayable = 0;
                *(undefined4 *)&pIVar22[1].dest.super_Displayable._vptr_Displayable = 0xfffffc19;
                pIVar22[1].super_Displayable._vptr_Displayable = (_func_int **)pVar38;
                *(undefined2 *)((long)&pIVar22[2].super_Displayable._vptr_Displayable + 1) = 1;
                pIVar37 = (puVar34->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                (puVar34->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = pIVar22;
                if (pIVar37 != (Inst *)0x0) {
                  (*(pIVar37->super_Displayable)._vptr_Displayable[5])();
                }
                this_02 = local_4b0;
                local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            CONCAT44(local_440._4_4_,local_420._8_4_);
                pmVar15 = std::
                          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          ::at(local_4b0,(key_type_conflict *)&local_440);
LAB_0013067c:
                pmVar15->is_temp_var = false;
                local_4b4 = (uint)CONCAT71((int7)((ulong)pmVar15 >> 8),1);
              }
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_310,(int *)&local_4cc);
            p_Var28 = (_Rb_tree_node_base *)(local_3d8._32_8_ + 0x18);
            for (p_Var29 = *(_Base_ptr *)(local_3d8._32_8_ + 0x28); p_Var29 != p_Var28;
                p_Var29 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var29)) {
              _Var14 = p_Var29[1]._M_color;
              p_Var18 = (_List_node_base *)operator_new(0x18);
              *(_Rb_tree_color *)&p_Var18[1]._M_next = _Var14;
              std::__detail::_List_node_base::_M_hook(p_Var18);
              local_3d8._16_8_ = (long)(_Rb_tree_color *)local_3d8._16_8_ + 1;
            }
          }
          else {
            p_Var7 = local_310._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var16 = &local_310._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var36 = p_Var16;
              p_Var32 = p_Var7;
              _Var14 = p_Var32[1]._M_color;
              p_Var16 = p_Var32;
              if ((int)_Var14 < (int)local_4cc) {
                p_Var16 = p_Var36;
              }
              p_Var7 = (&p_Var32->_M_left)[(int)_Var14 < (int)local_4cc];
            } while ((&p_Var32->_M_left)[(int)_Var14 < (int)local_4cc] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var16 == &local_310._M_impl.super__Rb_tree_header)
            goto LAB_0012f7b9;
            if ((int)_Var14 < (int)local_4cc) {
              p_Var32 = p_Var36;
            }
            if ((int)local_4cc < (int)p_Var32[1]._M_color) goto LAB_0012f7b9;
          }
        } while ((MirFunction *)local_3d8._0_8_ != (MirFunction *)local_3d8);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_310);
      pMVar10 = (MirFunction *)local_3d8._0_8_;
      while (pMVar10 != (MirFunction *)local_3d8) {
        pMVar9 = *(MirFunction **)&pMVar10->super_Displayable;
        operator_delete(pMVar10,0x18);
        pMVar10 = pMVar9;
      }
      std::
      _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
      ::~_Rb_tree(&local_d0);
      std::
      _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                   *)(local_108 + 8));
      livevar_analyse::Livevar_Analyse::~Livevar_Analyse(&local_a0);
    } while ((local_4b4 & 1) != 0);
  }
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    if (func.type->is_extern) {
      return;
    }

    auto& startblk = func.basic_blks.begin()->second;
    for (auto& blkpair : func.basic_blks) {
      auto& blk = blkpair.second;
      for (auto iter = blkpair.second.inst.begin();
           iter != blkpair.second.inst.end();) {
        auto& inst = *iter;
        if (inst->inst_kind() == mir::inst::InstKind::Ref) {
          auto& i = *inst;
          auto refinst = dynamic_cast<mir::inst::RefInst*>(&i);
          if (blk.id == startblk.id) {
            break;
          }
          func.variables.at(inst->dest.id).is_temp_var = false;
          startblk.inst.push_back(std::move(inst));
          iter = blk.inst.erase(iter);
        } else {
          iter++;
        }
      }
    }
    int cnt = 0;
    while (true) {
      bool modify = false;
      livevar_analyse::Livevar_Analyse lva(func);
      lva.build();
      var_replace::Var_Replace vp(func);
      env = std::make_shared<Env>(func, lva, vp, offset);
      std::list<mir::types::LabelId> queue;
      std::set<mir::types::LabelId> visited;
      auto iter = func.basic_blks.end();
      iter--;
      queue.push_back(iter->first);
      while (!queue.empty()) {
        auto start = queue.front();
        queue.pop_front();
        if (visited.count(start)) {
          continue;
        }

        auto& blk = func.basic_blks.at(start);
        {  // visit logic
          auto& block = blk;
          auto& blv = lva.livevars[start];
          auto& variables = func.variables;
          for (auto iter = block.inst.begin(); iter != block.inst.end();) {
            auto& inst = *iter;
            if (func.variables.at(inst->dest.id).is_phi_var) {
              iter++;
              continue;
            }
            auto kind = inst->inst_kind();
            auto& i = *inst;
            switch (kind) {
              case mir::inst::InstKind::Op: {
                auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
                if (opInst->lhs.is_immediate() && opInst->rhs.is_immediate()) {
                  break;
                }
                int id = -1;
                Op op(opInst->op, opInst->lhs, opInst->rhs);
                if (!opInst->lhs.is_immediate() &&
                    !opInst->rhs.is_immediate()) {
                  auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
                  auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
                  if (!blv->live_vars_in->count(lhs) ||
                      !blv->live_vars_in->count(rhs)) {
                    break;
                  }
                  id = bfs(start, op);
                } else if (!opInst->lhs.is_immediate()) {
                  auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
                  if (!blv->live_vars_in->count(lhs)) {
                    break;
                  }
                  id = bfs(start, op);

                } else if (!opInst->rhs.is_immediate()) {
                  auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
                  if (!blv->live_vars_in->count(rhs)) {
                    break;
                  }
                  id = bfs(start, op);
                }
                if (id == start) {
                  break;
                }
                auto var = env->blk_op_map.at(id).ops.at(op);
                if (func.variables.at(var.id).is_phi_var) {
                  vp.setdefpoint(inst->dest, id,
                                 func.basic_blks.at(id).inst.size());
                  for (auto var : inst->useVars()) {
                    auto& usepoints = vp.usepoints.at(var);
                    std::pair<mir::types::LabelId, int> point = {
                        blk.id, iter - block.inst.begin()};
                    auto find_iter =
                        std::find(usepoints.begin(), usepoints.end(), point);
                    if (find_iter != usepoints.end()) {
                      usepoints.erase(find_iter);
                      usepoints.push_back(
                          {id, func.basic_blks.at(id).inst.size()});
                    }
                  }
                  func.basic_blks.at(id).inst.push_back(std::move(inst));
                  inst = std::make_unique<mir::inst::AssignInst>(
                      mir::inst::VarId(-1), -1);
                } else {
                  LOG(TRACE)
                      << inst->dest << " is replaced to " << var << std::endl;
                  vp.replace(inst->dest, var);
                  // useless inst
                  inst =
                      std::make_unique<mir::inst::AssignInst>(inst->dest, -999);
                }
                func.variables.at(var).is_temp_var = false;
                modify = true;
                continue;
              }
              case mir::inst::InstKind::Load: {
                if (!offset) {
                  break;
                }
                auto loadInst = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
                LoadOp op = {{std::get<mir::inst::VarId>(loadInst->src),
                              loadInst->offset},
                             loadInst->dest};
                auto id = bfs(start, op);
                if (id == start) {
                  break;
                }
                auto var = env->blk_op_map.at(id).loads.at(op.first);
                if (!func.variables.at(var.id).is_phi_var) {
                  vp.replace(inst->dest, var);
                  // useless inst
                  inst =
                      std::make_unique<mir::inst::AssignInst>(inst->dest, -999);
                  func.variables.at(var).is_temp_var = false;
                  modify = true;
                  continue;
                } else {
                  break;
                }
              }
              // case mir::inst::InstKind::Store: {
              //   auto storeInst = dynamic_cast<mir::inst::StoreInst*>(&i);

              //   break;
              // }
              default:;
            }
            iter++;
          }
        }
        visited.insert(start);
        for (auto pre : blk.preceding) {
          queue.push_back(pre);
        }
      }
      if (!modify) {
        break;
      }
    }
  }